

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O1

void decompTest(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int w,int h,int pf,
               char *basename,int subsamp,int flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  tjscalingfactor sf;
  ulong uVar5;
  uint width;
  int iVar6;
  uint height;
  int iVar7;
  int iVar8;
  tjscalingfactor *ptVar9;
  byte *dstBuf;
  unsigned_long __size;
  tjhandle handle_00;
  long lVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  uchar *puVar17;
  char *pcVar18;
  ulong uVar19;
  undefined8 uVar20;
  ulong uVar21;
  int iVar22;
  undefined4 in_register_0000008c;
  ulong uVar23;
  size_t __size_00;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  byte *pbVar29;
  long lVar30;
  byte *local_100;
  int n;
  uchar *local_d8;
  long local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  undefined8 local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int _hdrh;
  int _hdrw;
  ulong local_88;
  byte *local_80;
  tjhandle local_78;
  ulong local_70;
  char *local_68;
  unsigned_long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  tjscalingfactor *local_40;
  long local_38;
  
  local_b0 = CONCAT44(in_register_0000008c,pf);
  n = 0;
  local_98 = h;
  local_78 = handle;
  ptVar9 = tjGetScalingFactors(&n);
  if ((ptVar9 == (tjscalingfactor *)0x0) || (n == 0)) {
    pcVar18 = tjGetErrorStr();
    printf("TurboJPEG ERROR:\n%s\n",pcVar18);
    exitStatus = -1;
  }
  else if (0 < n) {
    local_c8 = (long)(int)local_b0;
    local_70 = (ulong)basename & 0xffffffff;
    local_68 = "Bottom-Up";
    if ((subsamp & 2U) == 0) {
      local_68 = "Top-Down ";
    }
    uVar14 = local_c8 - 7;
    local_38 = 0;
    local_88 = uVar14;
    local_60 = jpegSize;
    local_40 = ptVar9;
    do {
      iVar12 = (int)basename;
      if ((iVar12 == 0) || (iVar12 == 3)) {
LAB_001081b1:
        sf = ptVar9[local_38];
        _hdrw = 0;
        _hdrh = 0;
        local_94 = -1;
        iVar28 = sf.num;
        iVar8 = sf.denom;
        width = (iVar28 * w + iVar8 + -1) / iVar8;
        uVar5 = (long)(iVar28 * local_98 + iVar8 + -1) / (long)iVar8;
        iVar6 = tjDecompressHeader2(local_78,jpegBuf,jpegSize,&_hdrw,&_hdrh,&local_94);
        if (iVar6 == -1) {
          pcVar18 = tjGetErrorStr();
          pcVar15 = "TurboJPEG ERROR:\n%s\n";
LAB_0010838f:
          printf(pcVar15,pcVar18);
          exitStatus = -1;
          dstBuf = (byte *)0x0;
          puVar17 = (uchar *)0x0;
        }
        else {
          if (((_hdrw != w) || (_hdrh != local_98)) || (local_94 != iVar12)) {
            pcVar15 = "ERROR: %s\n";
            pcVar18 = "Incorrect JPEG header";
            goto LAB_0010838f;
          }
          height = (uint)uVar5;
          local_d0 = (long)tjPixelSize[local_c8];
          __size_00 = (int)(height * width) * local_d0;
          dstBuf = (byte *)malloc(__size_00);
          if (dstBuf == (byte *)0x0) {
            printf("ERROR: %s\n","Memory allocation failure");
            exitStatus = -1;
            dstBuf = (byte *)0x0;
            puVar17 = (uchar *)0x0;
          }
          else {
            memset(dstBuf,0,__size_00);
            if (doYUV == 0) {
              printf("JPEG -> %s %s ",pixFormatStr[local_c8],local_68);
              if (iVar28 == 1 && iVar8 == 1) {
                printf("... ");
              }
              else {
                printf("%d/%d ... ",(ulong)sf & 0xffffffff,(ulong)sf >> 0x20);
              }
              iVar6 = tjDecompress2(local_78,jpegBuf,jpegSize,dstBuf,width,0,height,(int)local_b0,
                                    subsamp);
              if (iVar6 == -1) {
                pcVar18 = tjGetErrorStr();
                printf("TurboJPEG ERROR:\n%s\n",pcVar18);
                exitStatus = -1;
                puVar17 = (uchar *)0x0;
                goto LAB_001083a5;
              }
              local_d8 = (uchar *)0x0;
            }
            else {
              __size = tjBufSizeYUV2(width,pad,height,iVar12);
              handle_00 = tjInitDecompress();
              if (handle_00 == (tjhandle)0x0) {
                pcVar18 = tjGetErrorStr();
                pcVar15 = "TurboJPEG ERROR:\n%s\n";
LAB_001084eb:
                local_d8 = (uchar *)0x0;
                printf(pcVar15,pcVar18);
                exitStatus = -1;
                bVar13 = false;
              }
              else {
                local_d8 = (uchar *)malloc(__size);
                if (local_d8 == (uchar *)0x0) {
                  pcVar15 = "ERROR: %s\n";
                  pcVar18 = "Memory allocation failure";
                  goto LAB_001084eb;
                }
                memset(local_d8,0,__size);
                printf("JPEG -> YUV %s ",subNameLong[local_70]);
                if (iVar28 == 1 && iVar8 == 1) {
                  printf("... ");
                }
                else {
                  printf("%d/%d ... ",(ulong)sf & 0xffffffff,(ulong)sf >> 0x20);
                }
                puVar17 = local_d8;
                iVar6 = tjDecompressToYUV2(local_78,jpegBuf,jpegSize,local_d8,width,pad,height,
                                           subsamp);
                if (iVar6 == -1) {
                  pcVar18 = tjGetErrorStr();
                  bVar13 = false;
                  printf("TurboJPEG ERROR:\n%s\n",pcVar18);
                  exitStatus = -1;
                  uVar14 = local_88;
                }
                else {
                  iVar6 = checkBufYUV(puVar17,width,height,iVar12,sf);
                  pcVar18 = "Passed.";
                  if (iVar6 == 0) {
                    pcVar18 = "FAILED!";
                  }
                  puts(pcVar18);
                  printf("YUV %s -> %s %s ... ",subNameLong[local_70],pixFormatStr[local_c8],
                         local_68);
                  iVar6 = tjDecodeYUV(handle_00,puVar17,pad,iVar12,dstBuf,width,0);
                  if (iVar6 == -1) {
                    pcVar18 = tjGetErrorStr();
                    printf("TurboJPEG ERROR:\n%s\n",pcVar18);
                    exitStatus = -1;
                  }
                  else {
                    tjDestroy(handle_00);
                  }
                  bVar13 = iVar6 != -1;
                  uVar14 = local_88;
                }
              }
              jpegSize = local_60;
              puVar17 = local_d8;
              if (!bVar13) goto LAB_001083a5;
            }
            iVar7 = (iVar28 << 4) / iVar8;
            iVar8 = (iVar28 * 8) / iVar8;
            iVar6 = 0;
            iVar28 = 0;
            iVar22 = 0;
            if ((int)local_b0 != 6) {
              iVar6 = tjBlueOffset[local_c8];
              iVar28 = tjGreenOffset[local_c8];
              iVar22 = tjRedOffset[local_c8];
            }
            if ((int)local_b0 == 0xb) {
              if ((int)height < 1) {
                iVar16 = 1;
              }
              else {
                local_80 = dstBuf + 3;
                iVar12 = 1;
                uVar26 = 0;
                local_c0 = (ulong)width;
                local_a4 = iVar22;
                local_a0 = iVar28;
                local_9c = iVar6;
                do {
                  if (0 < (int)width) {
                    uVar11 = ~uVar26 + height;
                    if ((subsamp & 2U) == 0) {
                      uVar11 = uVar26;
                    }
                    local_b8 = CONCAT44(local_b8._4_4_,(int)uVar26 / iVar8);
                    pbVar29 = local_80 + (int)(uVar11 * width) * local_d0;
                    uVar24 = 0;
                    iVar16 = iVar12;
                    do {
                      bVar1 = pbVar29[-3];
                      uVar21 = (ulong)bVar1;
                      bVar2 = pbVar29[-2];
                      bVar3 = pbVar29[-1];
                      bVar4 = *pbVar29;
                      if (((int)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 |
                                       uVar24 & 0xffffffff) / (long)iVar8) + (int)local_b8 & 1U) ==
                          0) {
                        if (bVar1 < 0xfe) {
LAB_001087dc:
                          pcVar18 = "\nComp. %s at %d,%d should be 255, not %d\n";
                          pcVar15 = "c";
                        }
                        else if (bVar2 < 0xfe) {
LAB_001087bd:
                          pcVar18 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_001087c4:
                          pcVar15 = "m";
                          uVar21 = (ulong)bVar2;
                        }
                        else {
                          if (0xfd < bVar3) {
                            if ((int)uVar26 < iVar7) {
                              bVar13 = true;
                              if (bVar4 < 0xfe) goto LAB_00108829;
                            }
                            else {
                              bVar13 = true;
                              if (1 < bVar4) {
                                pcVar18 = "\nComp. %s at %d,%d should be 0, not %d\n";
                                goto LAB_00108830;
                              }
                            }
                            goto LAB_00108852;
                          }
                          pcVar18 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_00108811:
                          pcVar15 = "y";
                          uVar21 = (ulong)bVar3;
                        }
LAB_0010883d:
                        printf(pcVar18,pcVar15,(ulong)uVar26,uVar24 & 0xffffffff,uVar21);
                        exitStatus = -1;
                        iVar16 = 0;
                        bVar13 = false;
                      }
                      else {
                        if (bVar1 < 0xfe) goto LAB_001087dc;
                        if (1 < bVar3) {
                          pcVar18 = "\nComp. %s at %d,%d should be 0, not %d\n";
                          goto LAB_00108811;
                        }
                        if (bVar4 < 0xfe) {
LAB_00108829:
                          pcVar18 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_00108830:
                          pcVar15 = "k";
                          uVar21 = (ulong)bVar4;
                          goto LAB_0010883d;
                        }
                        if ((int)uVar26 < iVar7) {
                          bVar13 = true;
                          if (1 < bVar2) {
                            pcVar18 = "\nComp. %s at %d,%d should be 0, not %d\n";
                            goto LAB_001087c4;
                          }
                        }
                        else {
                          bVar13 = true;
                          if (bVar2 < 0xfe) goto LAB_001087bd;
                        }
                      }
LAB_00108852:
                      if (!bVar13) goto LAB_00108c1c;
                      uVar24 = uVar24 + 1;
                      pbVar29 = pbVar29 + local_d0;
                      iVar12 = iVar16;
                    } while (local_c0 != uVar24);
                  }
                  uVar26 = uVar26 + 1;
                  iVar16 = 1;
                } while (uVar26 != height);
              }
            }
            else {
              if ((int)height < 1) {
                iVar16 = 1;
                local_a4 = iVar22;
                local_a0 = iVar28;
                local_9c = iVar6;
              }
              else {
                local_58 = (long)tjAlphaOffset[local_c8];
                local_c0 = (ulong)iVar22;
                local_80 = (byte *)(long)iVar28;
                local_48 = (long)iVar6;
                iVar16 = 1;
                uVar26 = 0;
                local_a4 = iVar22;
                local_a0 = iVar28;
                local_9c = iVar6;
                local_50 = (ulong)width;
                do {
                  if (0 < (int)width) {
                    uVar11 = ~uVar26 + height;
                    if ((subsamp & 2U) == 0) {
                      uVar11 = uVar26;
                    }
                    local_b8 = CONCAT44(local_b8._4_4_,(int)uVar26 / iVar8);
                    pbVar29 = dstBuf + (int)(uVar11 * width) * local_d0;
                    uVar24 = 0;
                    do {
                      bVar1 = pbVar29[local_c0];
                      uVar21 = (ulong)bVar1;
                      bVar2 = pbVar29[(long)local_80];
                      bVar3 = pbVar29[local_48];
                      uVar23 = (ulong)bVar3;
                      uVar19 = 0xff;
                      if (uVar14 < 4) {
                        uVar19 = (ulong)pbVar29[local_58];
                      }
                      if (((int)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 |
                                       uVar24 & 0xffffffff) / (long)iVar8) + (int)local_b8 & 1U) ==
                          0) {
                        if ((int)uVar26 < iVar7) {
                          if (bVar1 < 0xfe) goto LAB_00108a91;
                          if (bVar2 < 0xfe) {
LAB_00108b09:
                            pcVar18 = "\nComp. %s at %d,%d should be 255, not %d\n";
                            goto LAB_00108b10;
                          }
                          if (0xfd < bVar3) goto LAB_00108b93;
                          pcVar18 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_00108b32:
                          pcVar15 = "b";
                          uVar21 = uVar23;
LAB_00108bb2:
                          printf(pcVar18,pcVar15,(ulong)uVar26,uVar24 & 0xffffffff,uVar21);
                          goto LAB_00108bb9;
                        }
                        if (1 < bVar1) {
                          pcVar18 = "\nComp. %s at %d,%d should be 0, not %d\n";
                          goto LAB_00108a98;
                        }
LAB_00108a4b:
                        if (1 < bVar2) {
                          pcVar18 = "\nComp. %s at %d,%d should be 0, not %d\n";
LAB_00108b10:
                          pcVar15 = "g";
                          uVar21 = (ulong)bVar2;
                          goto LAB_00108bb2;
                        }
LAB_00108b25:
                        if (1 < bVar3) {
                          pcVar18 = "\nComp. %s at %d,%d should be 0, not %d\n";
                          goto LAB_00108b32;
                        }
LAB_00108b93:
                        bVar13 = true;
                        if ((uint)uVar19 < 0xfe) {
                          pcVar18 = "\nComp. %s at %d,%d should be 255, not %d\n";
                          pcVar15 = "a";
                          uVar21 = uVar19;
                          goto LAB_00108bb2;
                        }
                      }
                      else {
                        if (iVar12 != 3) {
                          if ((int)uVar26 < iVar7) {
                            if (0xfd < bVar1) goto LAB_00108a4b;
                          }
                          else if (0xfd < bVar1) {
                            if (bVar2 < 0xfe) goto LAB_00108b09;
                            goto LAB_00108b25;
                          }
LAB_00108a91:
                          pcVar18 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_00108a98:
                          pcVar15 = "r";
                          goto LAB_00108bb2;
                        }
                        if ((int)uVar26 < iVar7) {
                          if ((byte)(bVar1 + 0xb2) < 0xfd) {
                            uVar20 = 0x4c;
LAB_00108a83:
                            pcVar18 = "r";
                            uVar23 = uVar21;
                          }
                          else {
                            if ((byte)(bVar2 + 0xb2) < 0xfd) {
                              uVar20 = 0x4c;
                              goto LAB_00108afb;
                            }
                            if (0xfc < (byte)(bVar3 + 0xb2)) goto LAB_00108b93;
                            pcVar18 = "b";
                            uVar20 = 0x4c;
                          }
                        }
                        else {
                          if ((byte)(bVar1 + 0x1c) < 0xfd) {
                            uVar20 = 0xe2;
                            goto LAB_00108a83;
                          }
                          if (0xfc < (byte)(bVar2 + 0x1c)) {
                            if ((byte)(bVar3 + 0x1c) < 0xfd) {
                              pcVar18 = "b";
                              uVar20 = 0xe2;
                              goto LAB_00108b8a;
                            }
                            goto LAB_00108b93;
                          }
                          uVar20 = 0xe2;
LAB_00108afb:
                          pcVar18 = "g";
                          uVar23 = (ulong)bVar2;
                        }
LAB_00108b8a:
                        printf("\nComp. %s at %d,%d should be %d, not %d\n",pcVar18,(ulong)uVar26,
                               uVar24 & 0xffffffff,uVar20,uVar23);
LAB_00108bb9:
                        exitStatus = -1;
                        iVar16 = 0;
                        bVar13 = false;
                      }
                      if (!bVar13) goto LAB_00108c1c;
                      uVar24 = uVar24 + 1;
                      pbVar29 = pbVar29 + local_d0;
                    } while (local_50 != uVar24);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != height);
              }
LAB_00108c1c:
              if ((0 < (int)height) && (iVar16 == 0)) {
                local_c0 = local_c0 & 0xffffffff00000000;
                lVar27 = (long)local_a4;
                lVar30 = (long)local_a0;
                lVar25 = (long)local_9c;
                lVar10 = (int)width * local_d0;
                uVar14 = 0;
                local_100 = dstBuf;
                local_b8 = (ulong)width;
                do {
                  uVar24 = local_b8;
                  pbVar29 = local_100;
                  if (0 < (int)width) {
                    do {
                      if ((int)local_b0 == 0xb) {
                        printf("%.3d/%.3d/%.3d/%.3d ",(ulong)*pbVar29,(ulong)pbVar29[1],
                               (ulong)pbVar29[2],(ulong)pbVar29[3]);
                      }
                      else {
                        printf("%.3d/%.3d/%.3d ",(ulong)pbVar29[lVar27],(ulong)pbVar29[lVar30],
                               (ulong)pbVar29[lVar25]);
                      }
                      uVar24 = uVar24 - 1;
                      pbVar29 = pbVar29 + local_d0;
                    } while (uVar24 != 0);
                  }
                  putchar(10);
                  uVar14 = uVar14 + 1;
                  local_100 = local_100 + lVar10;
                } while (uVar14 != (uVar5 & 0xffffffff));
                jpegSize = local_60;
                uVar14 = local_88;
                iVar16 = (int)local_c0;
              }
            }
            pcVar18 = "Passed.";
            if (iVar16 == 0) {
              pcVar18 = "FAILED!";
            }
            printf(pcVar18);
            putchar(10);
            puVar17 = local_d8;
          }
        }
LAB_001083a5:
        free(puVar17);
        free(dstBuf);
        ptVar9 = local_40;
      }
      else if (iVar12 == 5) {
        if ((ptVar9[local_38].num == 1) && (ptVar9[local_38].denom - 1U < 2)) goto LAB_001081b1;
      }
      else if (((ptVar9[local_38].num == 1) && ((uint)ptVar9[local_38].denom < 5)) &&
              ((0x16U >> (ptVar9[local_38].denom & 0x1fU) & 1) != 0)) goto LAB_001081b1;
      local_38 = local_38 + 1;
    } while (local_38 < n);
  }
  return;
}

Assistant:

static void decompTest(tjhandle handle, unsigned char *jpegBuf,
                       unsigned long jpegSize, int w, int h, int pf,
                       char *basename, int subsamp, int flags)
{
  int i, n = 0;
  tjscalingfactor *sf = tjGetScalingFactors(&n);

  if (!sf || !n) THROW_TJ();

  for (i = 0; i < n; i++) {
    if (subsamp == TJSAMP_444 || subsamp == TJSAMP_GRAY ||
        (subsamp == TJSAMP_411 && sf[i].num == 1 &&
         (sf[i].denom == 2 || sf[i].denom == 1)) ||
        (subsamp != TJSAMP_411 && sf[i].num == 1 &&
         (sf[i].denom == 4 || sf[i].denom == 2 || sf[i].denom == 1)))
      _decompTest(handle, jpegBuf, jpegSize, w, h, pf, basename, subsamp,
                  flags, sf[i]);
  }

bailout:
  return;
}